

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void shift_copy(uint8_t *src,uint8_t *dst,int shift,int width)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  void *in_RSI;
  byte *in_RDI;
  
  if (in_EDX < 0) {
    iVar1 = -in_EDX;
    memcpy(in_RSI,in_RDI + iVar1,(long)(in_ECX + in_EDX));
    memset((void *)((long)in_RSI + ((long)in_ECX - (long)iVar1)),(uint)in_RDI[in_ECX + -1],
           (long)iVar1);
  }
  else {
    memcpy((void *)((long)in_RSI + (long)in_EDX),in_RDI,(long)(in_ECX - in_EDX));
    memset(in_RSI,(uint)*in_RDI,(long)in_EDX);
  }
  return;
}

Assistant:

static inline void shift_copy(const uint8_t *src, uint8_t *dst, int shift,
                              int width) {
  if (shift >= 0) {
    memcpy(dst + shift, src, width - shift);
    memset(dst, src[0], shift);
  } else {
    shift = -shift;
    memcpy(dst, src + shift, width - shift);
    memset(dst + width - shift, src[width - 1], shift);
  }
}